

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_EvalFunctionInternal
                  (JSContext *ctx,JSValue fun_obj,JSValue this_obj,JSVarRef **var_refs,
                  JSStackFrame *sf)

{
  JSValue JVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  JSValueUnion m;
  int64_t unaff_R15;
  JSValue JVar7;
  
  m = fun_obj.u;
  uVar5 = (uint)fun_obj.tag;
  if (uVar5 != 0xfffffffd) {
    if (uVar5 == 0xfffffffe) {
      JVar7 = js_closure(ctx,fun_obj,var_refs,sf);
      JVar7 = JS_CallFree(ctx,JVar7,this_obj,0,(JSValue *)0x0);
      return JVar7;
    }
    if ((0xfffffff4 < uVar5) && (iVar4 = *m.ptr, *(int *)m.ptr = iVar4 + -1, iVar4 < 2)) {
      __JS_FreeValueRT(ctx->rt,fun_obj);
    }
    JS_ThrowTypeError(ctx,"bytecode function expected");
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  iVar4 = *m.ptr;
  *(int *)m.ptr = iVar4 + -1;
  if (iVar4 < 2) {
    __JS_FreeValueRT(ctx->rt,fun_obj);
  }
  iVar4 = js_create_module_function(ctx,(JSModuleDef *)m.ptr);
  if ((-1 < iVar4) && (iVar4 = js_link_module(ctx,(JSModuleDef *)m.ptr), -1 < iVar4)) {
    JVar7 = js_evaluate_module(ctx,(JSModuleDef *)m.ptr);
    unaff_R15 = JVar7.tag;
    m = JVar7.u;
    bVar3 = true;
    if ((int)JVar7.tag != 6) goto LAB_0012ccab;
  }
  JVar7.tag = unaff_R15;
  JVar7.u.float64 = m.float64;
  js_free_modules(ctx,JS_FREE_MODULE_NOT_EVALUATED);
  bVar3 = false;
LAB_0012ccab:
  uVar6 = 6;
  if (bVar3) {
    uVar6 = JVar7.tag;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar6;
  JVar1 = (JSValue)(auVar2 << 0x40);
  if (bVar3) {
    JVar1.tag = uVar6;
    JVar1.u.float64 = JVar7.u.float64;
  }
  return JVar1;
}

Assistant:

static JSValue JS_EvalFunctionInternal(JSContext *ctx, JSValue fun_obj,
                                       JSValueConst this_obj,
                                       JSVarRef **var_refs, JSStackFrame *sf)
{
    JSValue ret_val;
    uint32_t tag;

    tag = JS_VALUE_GET_TAG(fun_obj);
    if (tag == JS_TAG_FUNCTION_BYTECODE) {
        fun_obj = js_closure(ctx, fun_obj, var_refs, sf);
        ret_val = JS_CallFree(ctx, fun_obj, this_obj, 0, NULL);
    } else if (tag == JS_TAG_MODULE) {
        JSModuleDef *m;
        m = JS_VALUE_GET_PTR(fun_obj);
        /* the module refcount should be >= 2 */
        JS_FreeValue(ctx, fun_obj);
        if (js_create_module_function(ctx, m) < 0)
            goto fail;
        if (js_link_module(ctx, m) < 0)
            goto fail;
        ret_val = js_evaluate_module(ctx, m);
        if (JS_IsException(ret_val)) {
        fail:
            js_free_modules(ctx, JS_FREE_MODULE_NOT_EVALUATED);
            return JS_EXCEPTION;
        }
    } else {
        JS_FreeValue(ctx, fun_obj);
        ret_val = JS_ThrowTypeError(ctx, "bytecode function expected");
    }
    return ret_val;
}